

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmLocalGenerator *this_00;
  pointer ppcVar1;
  cmGeneratorTarget *this_01;
  size_type sVar2;
  __type _Var3;
  bool bVar4;
  TargetType TVar5;
  pointer ppcVar6;
  string *psVar7;
  mapped_type *this_02;
  _Base_ptr p_Var8;
  cmStateSnapshot *state;
  pointer ppcVar9;
  _Alloc_hider this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  targetsPerFolder;
  cmNinjaBuild build;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  cmLocalGenerator *local_1a8;
  string *local_1a0;
  pointer local_198;
  pointer local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_188;
  string local_158;
  undefined1 local_138 [64];
  pointer local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8 [6];
  
  WriteDivider(os);
  std::operator<<(os,"# Folder targets.\n\n");
  local_1a0 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          LocalGenerators.
                          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  local_188._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_188._M_impl.super__Rb_tree_header._M_header;
  local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_188._M_impl.super__Rb_tree_header._M_header._M_right =
       local_188._M_impl.super__Rb_tree_header._M_header._M_left;
  while (ppcVar6 != local_198) {
    this_00 = *ppcVar6;
    local_190 = ppcVar6;
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_1c8,this_00);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_138,(cmStateSnapshot *)&local_1c8);
    psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_138);
    _Var3 = std::operator==(psVar7,local_1a0);
    if (!_Var3) {
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              *)&local_188,psVar7);
      ppcVar1 = (this_00->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_1a8 = this_00;
      for (ppcVar9 = (this_00->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar1;
          ppcVar9 = ppcVar9 + 1) {
        this_01 = *ppcVar9;
        TVar5 = cmGeneratorTarget::GetType(this_01);
        if (TVar5 < GLOBAL_TARGET) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_138,"EXCLUDE_FROM_ALL",(allocator<char> *)&local_1c8);
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(this_01,(string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
          if (!bVar4) {
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_02,psVar7);
          }
        }
      }
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_138,local_1a8);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_1c8,
                 (cmStateSnapshot *)local_138);
      sVar2 = local_1c8._M_string_length;
      for (this_03._M_p = local_1c8._M_dataplus._M_p; this_03._M_p != (pointer)sVar2;
          this_03._M_p = this_03._M_p + 0x18) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_138,(cmStateSnapshot *)this_03._M_p)
        ;
        psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,psVar7,"/all");
        psVar7 = ConvertToNinjaPath(this,(string *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_02,psVar7);
        std::__cxx11::string::~string((string *)local_138);
      }
      std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
                ((_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_1c8);
    }
    ppcVar6 = local_190 + 1;
  }
  if (local_188._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"phony",(allocator<char> *)&local_1c8);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_138,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (char (*) [1])0x45404e);
    for (p_Var8 = local_188._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &local_188._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      WriteDivider(os);
      std::operator+(&local_1c8,"Folder: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
      std::__cxx11::string::operator=((string *)local_138,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::operator+(&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1),"/all");
      ConvertToNinjaPath(this,&local_1c8);
      std::__cxx11::string::_M_assign((string *)local_f8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(local_c8,p_Var8 + 2);
      WriteBuild(this,os,(cmNinjaBuild *)local_138,0,(bool *)0x0);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_188);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::string const& rootBinaryDir =
    this->LocalGenerators[0]->GetBinaryDirectory();

  std::map<std::string, cmNinjaDeps> targetsPerFolder;
  for (cmLocalGenerator const* lg : this->LocalGenerators) {
    std::string const& currentBinaryFolder(
      lg->GetStateSnapshot().GetDirectory().GetCurrentBinary());

    // Do not generate a rule for the root binary dir.
    if (currentBinaryFolder == rootBinaryDir) {
      continue;
    }

    // The directory-level rule should depend on the target-level rules
    // for all targets in the directory.
    cmNinjaDeps& folderTargets = targetsPerFolder[currentBinaryFolder];
    for (auto gt : lg->GetGeneratorTargets()) {
      cmStateEnums::TargetType const type = gt->GetType();
      if ((type == cmStateEnums::EXECUTABLE ||
           type == cmStateEnums::STATIC_LIBRARY ||
           type == cmStateEnums::SHARED_LIBRARY ||
           type == cmStateEnums::MODULE_LIBRARY ||
           type == cmStateEnums::OBJECT_LIBRARY ||
           type == cmStateEnums::UTILITY) &&
          !gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        folderTargets.push_back(gt->GetName());
      }
    }

    // The directory-level rule should depend on the directory-level
    // rules of the subdirectories.
    for (cmStateSnapshot const& state : lg->GetStateSnapshot().GetChildren()) {
      std::string const& currentBinaryDir =
        state.GetDirectory().GetCurrentBinary();
      folderTargets.push_back(
        this->ConvertToNinjaPath(currentBinaryDir + "/all"));
    }
  }

  if (!targetsPerFolder.empty()) {
    cmNinjaBuild build("phony");
    build.Outputs.emplace_back("");
    for (auto& it : targetsPerFolder) {
      cmGlobalNinjaGenerator::WriteDivider(os);
      std::string const& currentBinaryDir = it.first;

      // Setup target
      build.Comment = "Folder: " + currentBinaryDir;
      build.Outputs[0] = this->ConvertToNinjaPath(currentBinaryDir + "/all");
      build.ExplicitDeps = std::move(it.second);
      // Write target
      this->WriteBuild(os, build);
    }
  }
}